

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>::
deinit(ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
       *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
  *local_10;
  ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
  *this_local;
  
  local_10 = this;
  memset(&local_28,0,0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->m_zeroData,&local_28)
  ;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_28);
  BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>::deinit
            (&this->
              super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            );
  return;
}

Assistant:

void ModifyAfterBasicCase<SampleType>::deinit (void)
{
	m_zeroData = std::vector<deUint8>();

	BasicBufferCase<SampleType>::deinit();
}